

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O3

uint32_t icu_63::CollationFastLatin::lookupUTF8
                   (uint16_t *table,UChar32 c,uint8_t *s8,int32_t *sIndex,int32_t sLength)

{
  long lVar1;
  uint8_t uVar2;
  byte bVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  
  iVar4 = *sIndex;
  lVar1 = (long)iVar4 + 1;
  uVar5 = 1;
  if (sLength < 0 || (int)lVar1 < sLength) {
    uVar2 = s8[iVar4];
    bVar3 = s8[lVar1];
    uVar7 = (ulong)bVar3;
    *sIndex = iVar4 + 2;
    if ((char)bVar3 < -0x40 && (uVar2 == 0x80 && c == 0xe2)) {
      return (uint32_t)table[uVar7 + 0x100];
    }
    if (uVar2 == 0xbf && c == 0xef) {
      uVar6 = 1;
      if (uVar7 == 0xbf) {
        uVar6 = 0xfca8;
      }
      uVar5 = 3;
      if (uVar7 != 0xbe) {
        uVar5 = uVar6;
      }
    }
  }
  return uVar5;
}

Assistant:

uint32_t
CollationFastLatin::lookupUTF8(const uint16_t *table, UChar32 c,
                               const uint8_t *s8, int32_t &sIndex, int32_t sLength) {
    // The caller handled ASCII and valid/supported Latin.
    U_ASSERT(c > 0x7f);
    int32_t i2 = sIndex + 1;
    if(i2 < sLength || sLength < 0) {
        uint8_t t1 = s8[sIndex];
        uint8_t t2 = s8[i2];
        sIndex += 2;
        if(c == 0xe2 && t1 == 0x80 && 0x80 <= t2 && t2 <= 0xbf) {
            return table[(LATIN_LIMIT - 0x80) + t2];  // 2000..203F -> 0180..01BF
        } else if(c == 0xef && t1 == 0xbf) {
            if(t2 == 0xbe) {
                return MERGE_WEIGHT;  // U+FFFE
            } else if(t2 == 0xbf) {
                return MAX_SHORT | COMMON_SEC | LOWER_CASE | COMMON_TER;  // U+FFFF
            }
        }
    }
    return BAIL_OUT;
}